

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.h
# Opt level: O0

void __thiscall
CChromeTracer::addCallLogging
          (CChromeTracer *this,char *name,string *tag,uint64_t threadId,uint64_t startTime,
          uint64_t delta,uint64_t id)

{
  reference pvVar1;
  CChromeTracer *in_RCX;
  uint64_t in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_R8;
  char *in_R9;
  uint64_t in_stack_00000008;
  Record *rec;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  CChromeTracer *in_stack_ffffffffffffffa0;
  char **in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  vector<CChromeTracer::Record,_std::allocator<CChromeTracer::Record>_> *in_stack_ffffffffffffffc0;
  uint64_t in_stack_ffffffffffffffc8;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (*(int *)(in_RDI + 0x38) == 0) {
    std::__cxx11::string::c_str();
    writeCallLogging(in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,
                     (uint64_t)in_stack_ffffffffffffffc0,
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RSI);
  }
  else {
    std::vector<CChromeTracer::Record,std::allocator<CChromeTracer::Record>>::
    emplace_back<CChromeTracer::RecordType,char_const*&,std::__cxx11::string_const&>
              (in_stack_ffffffffffffffc0,(RecordType *)CONCAT44(in_stack_ffffffffffffffbc,3),
               in_stack_ffffffffffffffb0,in_RDI);
    pvVar1 = std::vector<CChromeTracer::Record,_std::allocator<CChromeTracer::Record>_>::back
                       ((vector<CChromeTracer::Record,_std::allocator<CChromeTracer::Record>_> *)
                        in_stack_ffffffffffffffa0);
    (pvVar1->field_3).CallLogging.ThreadId = (uint64_t)in_RCX;
    (pvVar1->field_3).CallLogging.StartTime = (uint64_t)in_R8;
    (pvVar1->field_3).CallLogging.Delta = (uint64_t)in_R9;
    (pvVar1->field_3).CallLogging.Id = in_stack_00000008;
    checkFlushRecords(in_stack_ffffffffffffffa0);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x22b27a);
  return;
}

Assistant:

void addCallLogging(
            const char* name,
            const std::string& tag,
            uint64_t threadId,
            uint64_t startTime,
            uint64_t delta,
            uint64_t id )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);
        if( m_BufferSize == 0 )
        {
            writeCallLogging(
                name,
                tag.c_str(),
                threadId,
                startTime,
                delta,
                id );
        }
        else
        {
            m_RecordBuffer.emplace_back(RecordType::CallLoggingTagId, name, tag);

            Record& rec = m_RecordBuffer.back();
            rec.CallLogging.ThreadId = threadId;
            rec.CallLogging.StartTime = startTime;
            rec.CallLogging.Delta = delta;
            rec.CallLogging.Id = id;

            checkFlushRecords();
        }
    }